

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# until-done.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *pppLVar1;
  void *pvVar2;
  uint uVar3;
  QueuePolicy *q_policy;
  time_t tVar4;
  undefined4 *b;
  Link *pLVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  int gid__;
  int iVar10;
  long lVar11;
  size_t *psVar12;
  int iVar13;
  communicator world;
  LoadBlock local_1918;
  SaveBlock local_18f8;
  DestroyBlock local_18d8;
  CreateBlock local_18b8;
  environment env;
  communicator local_1890;
  undefined1 local_1878 [32];
  _Rb_tree_node_base local_1858;
  size_t local_1838 [2];
  _Rb_tree_node_base local_1828;
  size_t local_1808;
  CollectivesList *local_1800;
  cothread_t pvStack_17f8;
  bool local_17f0;
  void *local_17e8;
  Link *local_17e0;
  _Any_data local_17d8;
  code *local_17c8;
  code *local_17c0;
  _Any_data local_17b8;
  code *local_17a8;
  code *local_17a0;
  _Any_data local_1798;
  code *local_1788;
  code *local_1780;
  int res;
  Master *pMStack_1768;
  IExchangeInfo *local_1760;
  _Rb_tree_node_base local_1750;
  size_t local_1730 [2];
  _Rb_tree_node_base local_1720;
  size_t local_1700;
  CollectivesList *local_16f8;
  cothread_t pvStack_16f0;
  bool local_16e8;
  FileStorage storage;
  Master master;
  
  local_1878._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(local_1878,&master,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  iVar10 = world.size_;
  pppLVar1 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"./DIY.XXXXXX","");
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_0013b508;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&storage.filename_templates_,1,(value_type *)&master,(allocator_type *)local_1878);
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  storage.filenames_.m_.mLock = 0;
  storage.max_size_.x_ = 0;
  storage.max_size_.m_.mLock = 0;
  storage.count_.x_ = 0;
  storage.count_.m_.mLock = 0;
  storage.current_size_.x_ = 0;
  storage.current_size_.m_.mLock = 0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar1) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  local_1890.comm_.data = world.comm_.data;
  local_1890.rank_ = world.rank_;
  local_1890.size_ = world.size_;
  local_1890.owner_ = false;
  local_18b8.super__Function_base._M_functor._8_8_ = 0;
  local_18b8.super__Function_base._M_functor._M_unused._M_object = create_block;
  local_18b8._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_18b8.super__Function_base._M_manager =
       std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_18d8.super__Function_base._M_functor._8_8_ = 0;
  local_18d8.super__Function_base._M_functor._M_unused._M_object = destroy_block;
  local_18d8._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_18d8.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_18f8.super__Function_base._M_functor._8_8_ = 0;
  local_18f8.super__Function_base._M_functor._M_unused._M_object = save_block;
  local_18f8._M_invoker =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_18f8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  local_1918.super__Function_base._M_functor._8_8_ = 0;
  local_1918.super__Function_base._M_functor._M_unused._M_object = load_block;
  local_1918._M_invoker =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_1918.super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0013b670;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_1890,-1,2,&local_18b8,&local_18d8,
                      &storage.super_ExternalStorage,&local_18f8,&local_1918,q_policy);
  if (local_1918.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1918.super__Function_base._M_manager)
              ((_Any_data *)&local_1918,(_Any_data *)&local_1918,__destroy_functor);
  }
  if (local_18f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18f8.super__Function_base._M_manager)
              ((_Any_data *)&local_18f8,(_Any_data *)&local_18f8,__destroy_functor);
  }
  if (local_18d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18d8.super__Function_base._M_manager)
              ((_Any_data *)&local_18d8,(_Any_data *)&local_18d8,__destroy_functor);
  }
  if (local_18b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_18b8.super__Function_base._M_manager)
              ((_Any_data *)&local_18b8,(_Any_data *)&local_18b8,__destroy_functor);
  }
  diy::mpi::communicator::~communicator(&local_1890);
  gid__ = 0;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  if (0 < iVar10) {
    iVar10 = iVar10 * 4;
    iVar13 = 1;
    if (1 < iVar10) {
      iVar13 = iVar10;
    }
    iVar10 = world.size_;
    do {
      if (gid__ % iVar10 == world.rank_) {
        b = (undefined4 *)operator_new(4);
        *b = 0;
        pLVar5 = (Link *)operator_new(0x20);
        (pLVar5->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013b7a8
        ;
        (pLVar5->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (pLVar5->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pLVar5->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        diy::Master::add(&master,gid__,b,pLVar5);
      }
      gid__ = gid__ + 1;
    } while (iVar13 != gid__);
  }
  do {
    _res = flip_coin;
    local_1878._0_8_ = 0;
    local_1878._8_8_ = (Master *)0x0;
    local_1878._24_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_1878._16_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&res,(Skip *)local_1878);
    if ((IExchangeInfo *)local_1878._16_8_ != (IExchangeInfo *)0x0) {
      (*(code *)local_1878._16_8_)((Proxy *)local_1878,(Proxy *)local_1878,3);
    }
    local_17d8._M_unused._M_object = (void *)0x0;
    local_17d8._8_8_ = 0;
    local_17c0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_17c8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_17b8._M_unused._M_object = (void *)0x0;
    local_17b8._8_8_ = 0;
    local_17a0 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_17a8 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1798._M_unused._M_object = (void *)0x0;
    local_1798._8_8_ = 0;
    local_1780 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1788 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_17d8);
    if (local_1788 != (code *)0x0) {
      (*local_1788)(&local_1798,&local_1798,__destroy_functor);
    }
    if (local_17a8 != (code *)0x0) {
      (*local_17a8)(&local_17b8,&local_17b8,__destroy_functor);
    }
    if (local_17c8 != (code *)0x0) {
      (*local_17c8)(&local_17d8,&local_17d8,__destroy_functor);
    }
    uVar6 = (ulong)((long)master.blocks_.elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)master.blocks_.elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    uVar3 = (uint)uVar6;
    if ((int)uVar3 < 1) {
      lVar11 = 0;
    }
    else {
      uVar8 = 0;
      do {
        uVar9 = uVar8;
        if (master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != (void *)0x0) break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar6;
      } while ((uVar3 & 0x7fffffff) != uVar8);
      lVar11 = (long)(int)uVar9;
    }
    diy::Master::Proxy::Proxy
              ((Proxy *)&res,&master,
               master.gids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11],(IExchangeInfo *)0x0);
    pvVar2 = master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
    pLVar5 = master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
    local_1878._0_8_ = _res;
    local_1878._8_8_ = pMStack_1768;
    local_1878._16_8_ = local_1760;
    if (local_1750._M_parent == (_Base_ptr)0x0) {
      local_1858._M_parent = (_Base_ptr)0x0;
      local_1858._M_color = _S_red;
      psVar12 = local_1838;
      local_1858._M_left = &local_1858;
      local_1858._M_right = &local_1858;
    }
    else {
      local_1858._M_parent = local_1750._M_parent;
      (local_1750._M_parent)->_M_parent = &local_1858;
      local_1838[0] = local_1730[0];
      local_1750._M_parent = (_Base_ptr)0x0;
      psVar12 = local_1730;
      local_1858._M_left = local_1750._M_left;
      local_1858._M_right = local_1750._M_right;
      local_1858._M_color = local_1750._M_color;
      local_1750._M_left = &local_1750;
      local_1750._M_right = &local_1750;
    }
    *psVar12 = 0;
    if (local_1720._M_parent == (_Base_ptr)0x0) {
      local_1828._M_parent = (_Base_ptr)0x0;
      local_1828._M_color = _S_red;
      local_1828._M_left = &local_1828;
      psVar12 = &local_1808;
      local_1828._M_right = local_1828._M_left;
    }
    else {
      local_1828._M_parent = local_1720._M_parent;
      (local_1720._M_parent)->_M_parent = &local_1828;
      local_1808 = local_1700;
      local_1720._M_parent = (_Base_ptr)0x0;
      psVar12 = &local_1700;
      local_1828._M_left = local_1720._M_left;
      local_1828._M_right = local_1720._M_right;
      local_1828._M_color = local_1720._M_color;
      local_1720._M_left = &local_1720;
      local_1720._M_right = &local_1720;
    }
    *psVar12 = 0;
    local_17f0 = local_16e8;
    local_1800 = local_16f8;
    pvStack_17f8 = pvStack_16f0;
    local_17e8 = pvVar2;
    local_17e0 = pLVar5;
    diy::Master::Proxy::~Proxy((Proxy *)&res);
    plVar7 = (long *)(local_1800->
                     super_list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>).
                     super__List_base<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>
                     ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    (**(code **)(*plVar7 + 0x20))(plVar7,(Proxy *)&res);
    iVar10 = res;
    diy::Master::Proxy::~Proxy((Proxy *)local_1878);
  } while (iVar10 == 0);
  if (world.rank_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Total iterations: ",0x12);
    uVar6 = (ulong)((long)master.blocks_.elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)master.blocks_.elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    uVar3 = (uint)uVar6;
    if ((int)uVar3 < 1) {
      lVar11 = 0;
    }
    else {
      uVar8 = 0;
      do {
        uVar9 = uVar8;
        if (master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != (void *)0x0) break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar6;
      } while ((uVar3 & 0x7fffffff) != uVar8);
      lVar11 = (long)(int)uVar9 << 3;
    }
    plVar7 = (long *)std::ostream::operator<<
                               ((ostream *)&std::cout,
                                **(int **)((long)master.blocks_.elements_.
                                                 super__Vector_base<void_*,_std::allocator<void_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar11)
                               );
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       nblocks = 4*world.size();

  diy::FileStorage          storage("./DIY.XXXXXX");

  diy::Master               master(world,
                                   -1,
                                   2,
                                   &create_block,
                                   &destroy_block,
                                   &storage,
                                   &save_block,
                                   &load_block);

  srand(static_cast<unsigned int>(time(NULL)));

  //diy::ContiguousAssigner   assigner(world.size(), nblocks);
  diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  for (int gid = 0; gid < nblocks; ++gid)
    if (assigner.rank(gid) == world.rank())
      master.add(gid, new Block, new diy::Link);

  bool all_done = false;
  while (!all_done)
  {
    master.foreach(&flip_coin);
    master.exchange();
    all_done = master.proxy(master.loaded_block()).read<int>();
  }

  if (world.rank() == 0)
    std::cout << "Total iterations: " << master.block<Block>(master.loaded_block())->count << std::endl;
}